

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xarray.c
# Opt level: O3

void xarray_unset(xarray_t *array,xuint index)

{
  uchar *puVar1;
  uchar uVar2;
  xarray_block_t *pxVar3;
  byte bVar4;
  ulong uVar5;
  void *__ptr;
  xarray_block_t *pxVar6;
  
  pxVar6 = &array->root;
  bVar4 = (array->root).shift;
  do {
    pxVar6 = (xarray_block_t *)pxVar6->values[index >> (bVar4 & 0x1f) & 0x3f];
    if (pxVar6 == (xarray_block_t *)0x0) {
      return;
    }
    bVar4 = pxVar6->shift;
  } while (bVar4 != 0);
  uVar5 = (ulong)(index & 0x3f);
  __ptr = pxVar6->values[uVar5];
  if (__ptr != (void *)0x0) {
    if (array->destroy_cb != (xarray_destroy_cb)0x0) {
      (*array->destroy_cb)((void *)((long)__ptr + 0x10));
      __ptr = pxVar6->values[uVar5];
    }
    free(__ptr);
    array->values = array->values - 1;
    puVar1 = &pxVar6->used;
    *puVar1 = *puVar1 + 0xff;
    uVar2 = *puVar1;
    while (uVar2 == '\0') {
      uVar5 = (ulong)pxVar6->parent_pos;
      pxVar3 = pxVar6->parent_block;
      if (pxVar3 == (xarray_block_t *)0x0) break;
      free(pxVar3->values[uVar5]);
      array->blocks = array->blocks - 1;
      puVar1 = &pxVar3->used;
      *puVar1 = *puVar1 + 0xff;
      pxVar6 = pxVar3;
      uVar2 = *puVar1;
    }
    pxVar6->values[uVar5] = (void *)0x0;
  }
  return;
}

Assistant:

void xarray_unset(xarray_t* array, xuint index)
{
    xarray_block_t* block = &array->root;
    int i;

    do
    {
        i = (index >> block->shift) & XARRAY_MASK;

        if (block->values[i])
            block = block->values[i];
        else
            return; /* has not been set */
    }
    while (block->shift > 0);

    i = index & XARRAY_MASK;

    if (block->values[i])
    {
        /* destroy a node */
        if (array->destroy_cb)
            array->destroy_cb(xarray_iter_value(
                        (xarray_iter_t)block->values[i]));
#if XARRAY_ENABLE_CACHE
        /* use 'xarray_node_t.block' to store next cache node */
        ((xarray_node_t*)block->values[i])->block
                        = (xarray_block_t*)array->nod_cache;
        array->nod_cache = block->values[i];
#else
        free(block->values[i]);
#endif
        --array->values;
        --block->used;

        /* release block chain if 'used == 0' */
        while (!block->used)
        {
            i = block->parent_pos;

            if (/* unlikely */!block->parent_block)
                break; /* only if unset the last value */

            block = block->parent_block;

            /* destroy a block */
#if XARRAY_ENABLE_CACHE
            /* use 'xarray_block_t.parent_block' to store next cache block */
            ((xarray_block_t*)block->values[i])
                        ->parent_block = array->blk_cache;
            array->blk_cache = block->values[i];
#else
            free(block->values[i]);
#endif
            --array->blocks;
            --block->used;
        }

        block->values[i] = NULL;
    }
}